

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_kernel_2.h
# Opt level: O2

void __thiscall
dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::
delete_nodes(queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>
             *this,node *start,node *end)

{
  node *pnVar1;
  
  while (start != end) {
    pnVar1 = start->next;
    memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
    ::deallocate(&this->pool,start);
    start = pnVar1;
  }
  memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
  ::deallocate(&this->pool,start);
  return;
}

Assistant:

void queue_kernel_2<T,block_size,mem_manager>::
    delete_nodes (
        node* start,
        node* end
    )
    {
        node* temp;
        while (start != end)
        {
            temp = start;
            start = start->next;
            pool.deallocate(temp);
        }
        pool.deallocate(start);
    }